

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__IfcRelDefines_00814b30;
  *(undefined ***)&this->field_0xc0 = &PTR__IfcRelDefines_00814ba8;
  *(undefined ***)&this->field_0x88 = &PTR__IfcRelDefines_00814b58;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelDefines_00814b80;
  pvVar1 = *(void **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>
                                     ).field_0x20 - (long)pvVar1);
  }
  *(undefined8 *)this = 0x814cc0;
  *(undefined8 *)&this->field_0xc0 = 0x814ce8;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}